

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileOptions *orig_options,FileDescriptor *descriptor)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FileDescriptor *local_20;
  FileDescriptor *descriptor_local;
  FileOptions *orig_options_local;
  DescriptorBuilder *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FileDescriptor *)orig_options;
  orig_options_local = (FileOptions *)this;
  psVar1 = FileDescriptor::package_abi_cxx11_(descriptor);
  std::operator+(&local_40,psVar1,".dummy");
  psVar1 = FileDescriptor::name_abi_cxx11_(local_20);
  AllocateOptionsImpl<google::protobuf::FileDescriptor>
            (this,&local_40,psVar1,(OptionsType *)descriptor_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileOptions& orig_options,
                                        FileDescriptor* descriptor) {
  // We add the dummy token so that LookupSymbol does the right thing.
  AllocateOptionsImpl(descriptor->package() + ".dummy", descriptor->name(),
                      orig_options, descriptor);
}